

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Expression * __thiscall wasm::DataFlow::Graph::getParent(Graph *this,Expression *curr)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false> local_30;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false> local_28;
  iterator iter;
  Expression *curr_local;
  Graph *this_local;
  
  iter.super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>)
           (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>)curr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
       ::find(&this->expressionParentMap,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
       ::end(&this->expressionParentMap);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (Graph *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false,_false>
                         *)&local_28);
    this_local = (Graph *)ppVar2->second;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* getParent(Expression* curr) {
    auto iter = expressionParentMap.find(curr);
    if (iter == expressionParentMap.end()) {
      return nullptr;
    }
    return iter->second;
  }